

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_64x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int32_t *piVar2;
  long lVar3;
  undefined4 *puVar4;
  byte bVar5;
  undefined2 uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  int8_t *piVar17;
  int16_t *piVar18;
  uint uVar19;
  long lVar20;
  undefined1 *puVar21;
  int32_t *piVar22;
  longlong *plVar23;
  long lVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined4 uVar47;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined4 uVar56;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i buf0 [64];
  __m128i buf1 [128];
  longlong local_c38 [2];
  undefined2 auStack_c28 [8];
  undefined1 auStack_c18 [16];
  undefined2 auStack_c08 [8];
  undefined1 auStack_bf8 [16];
  undefined2 auStack_be8 [8];
  undefined1 auStack_bd8 [16];
  undefined2 auStack_bc8 [456];
  longlong local_838 [14];
  undefined1 local_7c8 [1944];
  undefined1 auVar27 [12];
  undefined1 auVar29 [16];
  undefined1 auVar32 [12];
  undefined1 auVar36 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  
  piVar17 = av1_fwd_txfm_shift_ls[0x12];
  puVar21 = local_7c8;
  lVar24 = 0;
  do {
    lVar20 = 0;
    piVar18 = input;
    do {
      uVar11 = *(undefined8 *)(piVar18 + 4);
      *(undefined8 *)((long)local_c38 + lVar20) = *(undefined8 *)piVar18;
      *(undefined8 *)((long)auStack_c28 + lVar20 + -8) = uVar11;
      lVar20 = lVar20 + 0x10;
      piVar18 = piVar18 + stride;
    } while (lVar20 != 0x100);
    bVar5 = *piVar17;
    if ((char)bVar5 < '\0') {
      auVar28 = ZEXT416((uint)(1 << (~bVar5 & 0x1f)));
      auVar28 = pshuflw(auVar28,auVar28,0);
      auVar28._4_4_ = auVar28._0_4_;
      auVar28._8_4_ = auVar28._0_4_;
      auVar28._12_4_ = auVar28._0_4_;
      lVar20 = 0;
      do {
        auVar38 = paddsw(*(undefined1 (*) [16])((long)local_c38 + lVar20),auVar28);
        auVar38 = psraw(auVar38,ZEXT416((uint)-(int)(char)bVar5));
        *(undefined1 (*) [16])((long)local_c38 + lVar20) = auVar38;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x100);
    }
    else if (bVar5 != 0) {
      lVar20 = 0;
      do {
        auVar28 = psllw(*(undefined1 (*) [16])((long)local_c38 + lVar20),
                        ZEXT416((uint)(int)(char)bVar5));
        *(undefined1 (*) [16])((long)local_c38 + lVar20) = auVar28;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x100);
    }
    fdct8x16_new_sse2(&local_c38,&local_c38,'\r');
    bVar5 = piVar17[1];
    uVar19 = (uint)(char)bVar5;
    if ((int)uVar19 < 0) {
      auVar28 = ZEXT416((uint)(1 << (~bVar5 & 0x1f)));
      auVar28 = pshuflw(auVar28,auVar28,0);
      auVar38._0_4_ = auVar28._0_4_;
      auVar38._4_4_ = auVar38._0_4_;
      auVar38._8_4_ = auVar38._0_4_;
      auVar38._12_4_ = auVar38._0_4_;
      lVar20 = 0;
      do {
        auVar28 = paddsw(*(undefined1 (*) [16])((long)local_c38 + lVar20),auVar38);
        auVar28 = psraw(auVar28,ZEXT416(-uVar19));
        *(undefined1 (*) [16])((long)local_c38 + lVar20) = auVar28;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x100);
    }
    else if (bVar5 != 0) {
      lVar20 = 0;
      do {
        auVar28 = psllw(*(undefined1 (*) [16])((long)local_c38 + lVar20),ZEXT416(uVar19));
        *(undefined1 (*) [16])((long)local_c38 + lVar20) = auVar28;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x100);
    }
    lVar20 = 0;
    do {
      auVar28 = *(undefined1 (*) [16])((long)local_c38 + lVar20);
      auVar38 = *(undefined1 (*) [16])((long)auStack_c28 + lVar20 + 0x10);
      auVar42._0_12_ = auVar28._0_12_;
      auVar42._12_2_ = auVar28._6_2_;
      auVar42._14_2_ = *(undefined2 *)((long)auStack_c28 + lVar20 + 6);
      auVar41._12_4_ = auVar42._12_4_;
      auVar41._0_10_ = auVar28._0_10_;
      auVar41._10_2_ = *(undefined2 *)((long)auStack_c28 + lVar20 + 4);
      auVar40._10_6_ = auVar41._10_6_;
      auVar40._0_8_ = auVar28._0_8_;
      auVar40._8_2_ = auVar28._4_2_;
      auVar12._4_8_ = auVar40._8_8_;
      auVar12._2_2_ = *(undefined2 *)((long)auStack_c28 + lVar20 + 2);
      auVar12._0_2_ = auVar28._2_2_;
      auVar39._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_c28 + lVar20),auVar28._0_2_);
      auVar39._4_12_ = auVar12;
      auVar54._0_12_ = auVar38._0_12_;
      auVar54._12_2_ = auVar38._6_2_;
      auVar54._14_2_ = *(undefined2 *)((long)auStack_c08 + lVar20 + 6);
      auVar53._12_4_ = auVar54._12_4_;
      auVar53._0_10_ = auVar38._0_10_;
      auVar53._10_2_ = *(undefined2 *)((long)auStack_c08 + lVar20 + 4);
      auVar52._10_6_ = auVar53._10_6_;
      auVar52._0_8_ = auVar38._0_8_;
      auVar52._8_2_ = auVar38._4_2_;
      auVar13._4_8_ = auVar52._8_8_;
      auVar13._2_2_ = *(undefined2 *)((long)auStack_c08 + lVar20 + 2);
      auVar13._0_2_ = auVar38._2_2_;
      auVar33 = *(undefined1 (*) [16])((long)auStack_c08 + lVar20 + 0x10);
      auVar46._0_12_ = auVar33._0_12_;
      auVar46._12_2_ = auVar33._6_2_;
      auVar46._14_2_ = *(undefined2 *)((long)auStack_be8 + lVar20 + 6);
      auVar45._12_4_ = auVar46._12_4_;
      auVar45._0_10_ = auVar33._0_10_;
      auVar45._10_2_ = *(undefined2 *)((long)auStack_be8 + lVar20 + 4);
      auVar44._10_6_ = auVar45._10_6_;
      auVar44._0_8_ = auVar33._0_8_;
      auVar44._8_2_ = auVar33._4_2_;
      auVar14._4_8_ = auVar44._8_8_;
      auVar14._2_2_ = *(undefined2 *)((long)auStack_be8 + lVar20 + 2);
      auVar14._0_2_ = auVar33._2_2_;
      auVar43._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_be8 + lVar20),auVar33._0_2_);
      auVar43._4_12_ = auVar14;
      auVar42 = *(undefined1 (*) [16])((long)auStack_be8 + lVar20 + 0x10);
      uVar6 = *(undefined2 *)((long)auStack_bc8 + lVar20);
      auVar62._0_12_ = auVar42._0_12_;
      auVar62._12_2_ = auVar42._6_2_;
      auVar62._14_2_ = *(undefined2 *)((long)auStack_bc8 + lVar20 + 6);
      auVar61._12_4_ = auVar62._12_4_;
      auVar61._0_10_ = auVar42._0_10_;
      auVar61._10_2_ = *(undefined2 *)((long)auStack_bc8 + lVar20 + 4);
      auVar60._10_6_ = auVar61._10_6_;
      auVar60._0_8_ = auVar42._0_8_;
      auVar60._8_2_ = auVar42._4_2_;
      auVar15._4_8_ = auVar60._8_8_;
      auVar15._2_2_ = *(undefined2 *)((long)auStack_bc8 + lVar20 + 2);
      auVar15._0_2_ = auVar42._2_2_;
      uVar26 = CONCAT22(*(undefined2 *)((long)auStack_c28 + lVar20 + 8),auVar28._8_2_);
      auVar27._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_c28 + lVar20 + 10),CONCAT24(auVar28._10_2_,uVar26)
                   );
      auVar27._8_2_ = auVar28._12_2_;
      auVar27._10_2_ = *(undefined2 *)((long)auStack_c28 + lVar20 + 0xc);
      auVar29._12_2_ = auVar28._14_2_;
      auVar29._0_12_ = auVar27;
      auVar29._14_2_ = *(undefined2 *)((long)auStack_c28 + lVar20 + 0xe);
      uVar47 = CONCAT22(*(undefined2 *)((long)auStack_c08 + lVar20 + 8),auVar38._8_2_);
      auVar48._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_c08 + lVar20 + 10),CONCAT24(auVar38._10_2_,uVar47)
                   );
      auVar48._8_2_ = auVar38._12_2_;
      auVar48._10_2_ = *(undefined2 *)((long)auStack_c08 + lVar20 + 0xc);
      auVar49._12_2_ = auVar38._14_2_;
      auVar49._0_12_ = auVar48;
      auVar49._14_2_ = *(undefined2 *)((long)auStack_c08 + lVar20 + 0xe);
      uVar31 = CONCAT22(*(undefined2 *)((long)auStack_be8 + lVar20 + 8),auVar33._8_2_);
      auVar32._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_be8 + lVar20 + 10),CONCAT24(auVar33._10_2_,uVar31)
                   );
      auVar32._8_2_ = auVar33._12_2_;
      auVar32._10_2_ = *(undefined2 *)((long)auStack_be8 + lVar20 + 0xc);
      auVar33._12_2_ = auVar33._14_2_;
      auVar33._0_12_ = auVar32;
      auVar33._14_2_ = *(undefined2 *)((long)auStack_be8 + lVar20 + 0xe);
      uVar56 = CONCAT22(*(undefined2 *)((long)auStack_bc8 + lVar20 + 8),auVar42._8_2_);
      auVar57._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_bc8 + lVar20 + 10),CONCAT24(auVar42._10_2_,uVar56)
                   );
      auVar57._8_2_ = auVar42._12_2_;
      auVar57._10_2_ = *(undefined2 *)((long)auStack_bc8 + lVar20 + 0xc);
      auVar58._12_2_ = auVar42._14_2_;
      auVar58._0_12_ = auVar57;
      auVar58._14_2_ = *(undefined2 *)((long)auStack_bc8 + lVar20 + 0xe);
      auVar50._0_8_ = auVar39._0_8_;
      auVar50._8_4_ = auVar12._0_4_;
      auVar50._12_4_ = auVar13._0_4_;
      auVar51._0_8_ = auVar43._0_8_;
      auVar51._8_4_ = auVar14._0_4_;
      auVar51._12_4_ = auVar15._0_4_;
      auVar55._8_4_ = (int)((ulong)auVar27._0_8_ >> 0x20);
      auVar55._0_8_ = auVar27._0_8_;
      auVar55._12_4_ = (int)((ulong)auVar48._0_8_ >> 0x20);
      auVar59._8_4_ = (int)((ulong)auVar32._0_8_ >> 0x20);
      auVar59._0_8_ = auVar32._0_8_;
      auVar59._12_4_ = (int)((ulong)auVar57._0_8_ >> 0x20);
      auVar34._0_8_ = CONCAT44(auVar57._8_4_,auVar32._8_4_);
      auVar34._8_4_ = auVar33._12_4_;
      auVar34._12_4_ = auVar58._12_4_;
      *(ulong *)(puVar21 + lVar20 * 8 + -0x70) =
           CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_c08 + lVar20),auVar38._0_2_),
                    auVar39._0_4_);
      *(ulong *)((long)(puVar21 + lVar20 * 8 + -0x70) + 8) =
           CONCAT44(CONCAT22(uVar6,auVar42._0_2_),auVar43._0_4_);
      *(long *)(puVar21 + lVar20 * 8 + -0x60) = auVar50._8_8_;
      *(long *)((long)(puVar21 + lVar20 * 8 + -0x60) + 8) = auVar51._8_8_;
      puVar4 = (undefined4 *)(puVar21 + lVar20 * 8 + -0x50);
      *puVar4 = auVar40._8_4_;
      puVar4[1] = auVar52._8_4_;
      puVar4[2] = auVar44._8_4_;
      puVar4[3] = auVar60._8_4_;
      lVar3 = lVar20 * 8;
      *(undefined4 *)(puVar21 + lVar3 + -0x38) = auVar41._12_4_;
      *(undefined4 *)(puVar21 + lVar3 + -0x34) = auVar53._12_4_;
      *(undefined4 *)(puVar21 + lVar3 + -0x30) = auVar45._12_4_;
      *(undefined4 *)(puVar21 + lVar3 + -0x2c) = auVar61._12_4_;
      *(ulong *)(puVar21 + lVar20 * 8 + -0x30) = CONCAT44(uVar47,uVar26);
      *(ulong *)((long)(puVar21 + lVar20 * 8 + -0x30) + 8) = CONCAT44(uVar56,uVar31);
      *(long *)(puVar21 + lVar20 * 8 + -0x20) = auVar55._8_8_;
      *(long *)((long)(puVar21 + lVar20 * 8 + -0x20) + 8) = auVar59._8_8_;
      puVar4 = (undefined4 *)(puVar21 + lVar20 * 8 + -0x10);
      *puVar4 = auVar27._8_4_;
      puVar4[1] = auVar48._8_4_;
      *(undefined8 *)(puVar4 + 2) = auVar34._0_8_;
      *(int *)(puVar21 + lVar20 * 8 + 8) = auVar29._12_4_;
      *(int *)(puVar21 + lVar20 * 8 + 0xc) = auVar49._12_4_;
      *(long *)(puVar21 + lVar20 * 8 + 8) = auVar34._8_8_;
      lVar20 = lVar20 + 0x80;
    } while (lVar20 == 0x80);
    lVar24 = lVar24 + 1;
    input = input + 8;
    puVar21 = puVar21 + 0x80;
  } while (lVar24 != 8);
  piVar22 = output + 4;
  plVar23 = local_838;
  lVar24 = 0;
  do {
    av1_fdct8x64_new_sse2
              ((__m128i *)(local_838 + lVar24 * 0x80),(__m128i *)(local_838 + lVar24 * 0x80),'\f');
    bVar5 = piVar17[2];
    if ((char)bVar5 < '\0') {
      auVar28 = ZEXT416((uint)(1 << (~bVar5 & 0x1f)));
      auVar28 = pshuflw(auVar28,auVar28,0);
      auVar30._0_4_ = auVar28._0_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      auVar34 = ZEXT416((uint)-(int)(char)bVar5);
      lVar20 = 0;
      do {
        auVar28 = paddsw(*(undefined1 (*) [16])((long)plVar23 + lVar20),auVar30);
        auVar28 = psraw(auVar28,auVar34);
        *(undefined1 (*) [16])((long)plVar23 + lVar20) = auVar28;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x400);
    }
    else if (bVar5 != 0) {
      lVar20 = 0;
      do {
        auVar34 = psllw(*(undefined1 (*) [16])((long)plVar23 + lVar20),
                        ZEXT416((uint)(int)(char)bVar5));
        *(undefined1 (*) [16])((long)plVar23 + lVar20) = auVar34;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x400);
    }
    lVar20 = 0;
    do {
      psVar1 = (short *)((long)plVar23 + lVar20);
      sVar7 = psVar1[4];
      sVar8 = psVar1[5];
      sVar9 = psVar1[6];
      sVar10 = psVar1[7];
      auVar37._0_12_ = auVar34._0_12_;
      auVar37._12_2_ = auVar34._6_2_;
      auVar37._14_2_ = psVar1[3];
      auVar36._12_4_ = auVar37._12_4_;
      auVar36._0_10_ = auVar34._0_10_;
      auVar36._10_2_ = psVar1[2];
      auVar35._10_6_ = auVar36._10_6_;
      auVar35._0_8_ = auVar34._0_8_;
      auVar35._8_2_ = auVar34._4_2_;
      auVar16._4_8_ = auVar35._8_8_;
      auVar16._2_2_ = psVar1[1];
      auVar16._0_2_ = auVar34._2_2_;
      auVar34._0_4_ = (int)*psVar1;
      auVar34._4_4_ = auVar16._0_4_ >> 0x10;
      auVar34._8_4_ = auVar35._8_4_ >> 0x10;
      auVar34._12_4_ = auVar36._12_4_ >> 0x10;
      *(undefined1 (*) [16])(piVar22 + lVar20 + -4) = auVar34;
      piVar2 = piVar22 + lVar20;
      *piVar2 = (int)sVar7;
      piVar2[1] = (int)sVar8;
      piVar2[2] = (int)sVar9;
      piVar2[3] = (int)sVar10;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x200);
    plVar23 = plVar23 + 0x80;
    piVar22 = piVar22 + 8;
    bVar25 = lVar24 == 0;
    lVar24 = lVar24 + 1;
  } while (bVar25);
  memset(output + 0x200,0,0x800);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_64x16_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X16;
  __m128i buf0[64], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = fdct8x16_new_sse2;
  const transform_1d_sse2 row_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < height_div8; ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < height_div8; i++) {
    __m128i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, 16, 32);
  }
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
}